

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.hpp
# Opt level: O0

void __thiscall antlr::CommonAST::~CommonAST(CommonAST *this)

{
  BaseAST *in_RDI;
  
  (in_RDI->super_AST)._vptr_AST = (_func_int **)&PTR__CommonAST_004fe708;
  std::__cxx11::string::~string((string *)&in_RDI[1].super_AST.ref);
  BaseAST::~BaseAST(in_RDI);
  return;
}

Assistant:

virtual ~CommonAST()
	{
	}